

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::deleteRenderbuffer(ReferenceContext *this,Renderbuffer *renderbuffer)

{
  Framebuffer *pFVar1;
  Framebuffer *pFVar2;
  int iVar3;
  int iVar4;
  int point;
  long lVar5;
  Framebuffer *pFVar6;
  Attachment *attachment;
  bool bVar7;
  
  if (this->m_renderbufferBinding == renderbuffer) {
    (*(this->super_Context)._vptr_Context[0xc])(this,0x8d41,0);
  }
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    pFVar1 = this->m_readFramebufferBinding;
    pFVar2 = this->m_drawFramebufferBinding;
    pFVar6 = pFVar2;
    if (iVar3 == 0) {
      pFVar6 = pFVar1;
    }
    if (pFVar6 != (Framebuffer *)0x0) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        if (pFVar6->m_attachments[lVar5].name == (renderbuffer->super_NamedObject).m_name) {
          attachment = pFVar6->m_attachments + lVar5;
          iVar4 = (uint)(pFVar6 == pFVar1) + (uint)(pFVar6 == pFVar2);
          while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
            releaseFboAttachmentReference(this,attachment);
          }
          attachment->type = ATTACHMENTTYPE_LAST;
          attachment->name = 0;
          attachment->texTarget = TEXTARGET_LAST;
          attachment->level = 0;
          attachment->layer = 0;
        }
      }
    }
  }
  rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference(&this->m_renderbuffers,renderbuffer);
  return;
}

Assistant:

void ReferenceContext::deleteRenderbuffer (Renderbuffer* renderbuffer)
{
	if (m_renderbufferBinding == renderbuffer)
		bindRenderbuffer(GL_RENDERBUFFER, 0);

	// Unbind from currently bound framebuffers
	for (int ndx = 0; ndx < 2; ndx++)
	{
		rc::Framebuffer* framebufferBinding = ndx ? m_drawFramebufferBinding : m_readFramebufferBinding;
		if (framebufferBinding)
		{
			int releaseRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
								+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
			{
				Framebuffer::Attachment& attachment = framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
				if (attachment.name == renderbuffer->getName())
				{
					for (int refNdx = 0; refNdx < releaseRefCount; refNdx++)
						releaseFboAttachmentReference(attachment);
					attachment = Framebuffer::Attachment();
				}
			}
		}
	}

	DE_ASSERT(renderbuffer->getRefCount() == 1);
	m_renderbuffers.releaseReference(renderbuffer);
}